

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void unroll(lua_State *L,void *ud)

{
  CallInfo *ci_00;
  CallInfo *ci;
  void *ud_local;
  lua_State *L_local;
  
  while (ci_00 = L->ci, ci_00 != &L->base_ci) {
    if ((ci_00->callstatus & 0x8000) == 0) {
      luaV_finishOp(L);
      luaV_execute(L,ci_00);
    }
    else {
      finishCcall(L,ci_00);
    }
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  CallInfo *ci;
  UNUSED(ud);
  while ((ci = L->ci) != &L->base_ci) {  /* something in the stack */
    if (!isLua(ci))  /* C function? */
      finishCcall(L, ci);  /* complete its execution */
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L, ci);  /* execute down to higher C 'boundary' */
    }
  }
}